

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

ITexture * __thiscall
irr::video::CNullDriver::loadTextureFromFile(CNullDriver *this,IReadFile *file,path *hashName)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ITexture *pIVar3;
  double __x;
  long *plVar2;
  undefined4 extraout_var_01;
  
  iVar1 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x46])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
    pIVar3 = (ITexture *)0x0;
  }
  else {
    if ((int)(hashName->str)._M_string_length == 0) {
      iVar1 = (*file->_vptr_IReadFile[4])(file);
      hashName = (path *)CONCAT44(extraout_var_00,iVar1);
    }
    iVar1 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x75])(this,hashName,plVar2);
    pIVar3 = (ITexture *)CONCAT44(extraout_var_01,iVar1);
    if (pIVar3 != (ITexture *)0x0) {
      (*file->_vptr_IReadFile[4])(file);
      os::Printer::log(__x);
    }
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  }
  return pIVar3;
}

Assistant:

video::ITexture *CNullDriver::loadTextureFromFile(io::IReadFile *file, const io::path &hashName)
{
	ITexture *texture = nullptr;

	IImage *image = createImageFromFile(file);
	if (!image)
		return nullptr;

	if (checkImage(image)) {
		texture = createDeviceDependentTexture(hashName.size() ? hashName : file->getFileName(), image);
		if (texture)
			os::Printer::log("Loaded texture", file->getFileName(), ELL_DEBUG);
	}

	image->drop();

	return texture;
}